

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

idx_t __thiscall
duckdb::CSVErrorHandler::GetLine(CSVErrorHandler *this,LinesPerBoundary *error_info)

{
  int iVar1;
  idx_t iVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    iVar2 = GetLineInternal(this,error_info);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return iVar2;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

idx_t CSVErrorHandler::GetLine(const LinesPerBoundary &error_info) {
	lock_guard<mutex> parallel_lock(main_mutex);
	return GetLineInternal(error_info);
}